

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CloneOperator::process
          (CloneOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  size_type sVar2;
  long in_RSI;
  Message *in_RDI;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  res;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_helics::Message_*,_false> this_00;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_30 [2];
  
  this_00._M_head_impl = in_RDI;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
                      *)0x283b98);
  if (bVar1) {
    in_stack_ffffffffffffffa0 =
         (vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          *)(in_RSI + 8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::get
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_ffffffffffffffa0);
    std::
    function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
    ::operator()((function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
                  *)this_00._M_head_impl,in_RDI);
    sVar2 = std::
            vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            ::size(local_30);
    if (sVar2 == 1) {
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::front(in_stack_ffffffffffffffa0);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::~vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               *)in_RDI);
    if (sVar2 == 1) {
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             this_00._M_head_impl;
    }
  }
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)this_00._M_head_impl;
}

Assistant:

std::unique_ptr<Message> CloneOperator::process(std::unique_ptr<Message> message)
{
    if (evalFunction) {
        auto res = evalFunction(message.get());
        if (res.size() == 1) {
            return std::move(res.front());
        }
    }
    return message;
}